

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *pSVar2;
  SQClosure *x;
  SQNativeClosure *x_00;
  SQNativeClosure *c_1;
  SQClosure *c;
  SQObjectPtr ret;
  SQWeakRef *w;
  SQObjectPtr *env;
  SQObjectPtr *o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  pSVar1 = stack_get(v,idx);
  if (((pSVar1->super_SQObject)._type == OT_NATIVECLOSURE) ||
     ((pSVar1->super_SQObject)._type == OT_CLOSURE)) {
    pSVar2 = stack_get(v,-1);
    if (((pSVar2->super_SQObject)._type == OT_TABLE) ||
       ((((pSVar2->super_SQObject)._type == OT_ARRAY || ((pSVar2->super_SQObject)._type == OT_CLASS)
         ) || ((pSVar2->super_SQObject)._type == OT_INSTANCE)))) {
      ret.super_SQObject._unVal.pWeakRef =
           SQRefCounted::GetWeakRef
                     ((pSVar2->super_SQObject)._unVal.pRefCounted,(pSVar2->super_SQObject)._type);
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)&c);
      if ((pSVar1->super_SQObject)._type == OT_CLOSURE) {
        x = SQClosure::Clone((pSVar1->super_SQObject)._unVal.pClosure);
        if (x->_env != (SQWeakRef *)0x0) {
          (x->_env->super_SQRefCounted)._uiRef = (x->_env->super_SQRefCounted)._uiRef - 1;
          if ((x->_env->super_SQRefCounted)._uiRef == 0) {
            (*(x->_env->super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          x->_env = (SQWeakRef *)0x0;
        }
        x->_env = (SQWeakRef *)ret.super_SQObject._unVal;
        (x->_env->super_SQRefCounted)._uiRef = (x->_env->super_SQRefCounted)._uiRef + 1;
        if (((pSVar1->super_SQObject)._unVal.pTable)->_nodes != (_HashNode *)0x0) {
          x->_base = (SQClass *)((pSVar1->super_SQObject)._unVal.pTable)->_nodes;
          (x->_base->super_SQCollectable).super_SQRefCounted._uiRef =
               (x->_base->super_SQCollectable).super_SQRefCounted._uiRef + 1;
        }
        SQObjectPtr::operator=((SQObjectPtr *)&c,x);
      }
      else {
        x_00 = SQNativeClosure::Clone((pSVar1->super_SQObject)._unVal.pNativeClosure);
        if (x_00->_env != (SQWeakRef *)0x0) {
          (x_00->_env->super_SQRefCounted)._uiRef = (x_00->_env->super_SQRefCounted)._uiRef - 1;
          if ((x_00->_env->super_SQRefCounted)._uiRef == 0) {
            (*(x_00->_env->super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          x_00->_env = (SQWeakRef *)0x0;
        }
        x_00->_env = (SQWeakRef *)ret.super_SQObject._unVal;
        (x_00->_env->super_SQRefCounted)._uiRef = (x_00->_env->super_SQRefCounted)._uiRef + 1;
        SQObjectPtr::operator=((SQObjectPtr *)&c,x_00);
      }
      SQVM::Pop(v);
      SQVM::Push(v,(SQObjectPtr *)&c);
      v_local = (HSQUIRRELVM)0x0;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&c);
    }
    else {
      v_local = (HSQUIRRELVM)sq_throwerror(v,"invalid environment");
    }
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"the target is not a closure");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    SQObjectPtr &env = stack_get(v,-1);
    if(!sq_istable(env) &&
        !sq_isarray(env) &&
        !sq_isclass(env) &&
        !sq_isinstance(env))
        return sq_throwerror(v,_SC("invalid environment"));
    SQWeakRef *w = _refcounted(env)->GetWeakRef(type(env));
    SQObjectPtr ret;
    if(sq_isclosure(o)) {
        SQClosure *c = _closure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        if(_closure(o)->_base) {
            c->_base = _closure(o)->_base;
            __ObjAddRef(c->_base);
        }
        ret = c;
    }
    else { //then must be a native closure
        SQNativeClosure *c = _nativeclosure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        ret = c;
    }
    v->Pop();
    v->Push(ret);
    return SQ_OK;
}